

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Tstore<double>(VM *this)

{
  int_t addr;
  double_t value;
  
  value = POP<double>(this);
  addr = POP<int>(this);
  WRITE<double>(this,addr,value);
  return;
}

Assistant:

void VM::Tstore() {
    auto value = POP<T>();
    auto addr = POP<addr_t>();
    WRITE(addr, value);
}